

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int encode_boolean_value(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,_Bool value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  undefined7 in_register_00000011;
  uchar local_a [2];
  
  if ((int)CONCAT71(in_register_00000011,value) == 0) {
    local_a[0] = '\0';
    iVar1 = (*encoder_output)(context,local_a,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x94e;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x94e;
    }
    iVar3 = 0x94d;
  }
  else {
    local_a[1] = 1;
    iVar1 = (*encoder_output)(context,local_a + 1,1);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x95c;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x95c;
    }
    iVar3 = 0x95b;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"encode_boolean_value",iVar3,1,"Failed encoding boolean value");
  return iVar1;
}

Assistant:

static int encode_boolean_value(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, bool value)
{
    int result;

    if (value == false)
    {
        /* Codes_SRS_AMQPVALUE_01_270: [<encoding code="0x56" category="fixed" width="1" label="boolean with the octet 0x00 being false and octet 0x01 being true"/>] */
        if (output_byte(encoder_output, context, 0x00) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding boolean value");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_270: [<encoding code="0x56" category="fixed" width="1" label="boolean with the octet 0x00 being false and octet 0x01 being true"/>] */
        if (output_byte(encoder_output, context, 0x01) != 0)
        {
            /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
            LogError("Failed encoding boolean value");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}